

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O0

bool __thiscall
ec::base_protobuf::get_varint<unsigned_int,void>
          (base_protobuf *this,uint8_t **pd,int *len,uint *out)

{
  bool local_41;
  int local_34;
  int nbit;
  uint *out_local;
  int *len_local;
  uint8_t **pd_local;
  base_protobuf *this_local;
  
  if (0 < *len) {
    local_34 = 0;
    *out = 0;
    do {
      *out = (**pd & 0x7f) << ((byte)local_34 & 0x1f) | *out;
      if ((**pd & 0x80) == 0) {
        *pd = *pd + 1;
        *len = *len + -1;
        return true;
      }
      local_34 = local_34 + 7;
      *pd = *pd + 1;
      *len = *len + -1;
      local_41 = 0 < *len && local_34 < 0x20;
    } while (local_41);
    this->_lasterr = 2;
  }
  return false;
}

Assistant:

bool get_varint(const uint8_t *&pd, int &len, _Tp &out) //get Varint (Base 128 Varints)
    {
        if (len <= 0) {
            return false;
        }

        int nbit = 0;
        out = 0;

        do {
            out |= (*pd & (_Tp)0x7F) << nbit;

            if (!(*pd & 0x80)) {
                pd++;
                len--;
                return true;
            }

            nbit += 7;
            pd++;
            len--;
        } while (len > 0 && nbit < ((int)sizeof(_Tp) * 8));

        _lasterr = pberr_decode;
        return false;
    }